

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLedgerEntry.cpp
# Opt level: O3

string * __thiscall
jbcoin::STLedgerEntry::getFullText_abi_cxx11_(string *__return_storage_ptr__,STLedgerEntry *this)

{
  _Base_ptr p_Var1;
  LedgerEntryType size;
  _Base_ptr p_Var2;
  string local_48;
  
  LedgerFormats::getInstance();
  if (LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.m_types._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    size = this->type_;
    p_Var1 = &LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.
              m_types._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var2 = LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.
             m_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (size <= (int)p_Var2[1]._M_color) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < size];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var1 !=
          &LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.m_types.
           _M_t._M_impl.super__Rb_tree_header) && ((int)p_Var1[1]._M_color <= size)) &&
       (p_Var2 = p_Var1[1]._M_parent, p_Var2 != (_Base_ptr)0x0)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"","");
      strHex<unsigned_char_const*>(&local_48,(jbcoin *)&this->key_,&DAT_00000020,size);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var2[1]._M_left);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      STObject::getFullText_abi_cxx11_(&local_48,&this->super_STObject);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  Throw<std::runtime_error,char_const(&)[26]>((char (*) [26])"invalid ledger entry type");
}

Assistant:

std::string STLedgerEntry::getFullText () const
{
    auto const format =
        LedgerFormats::getInstance().findByType (type_);

    if (format == nullptr)
        Throw<std::runtime_error> ("invalid ledger entry type");

    std::string ret = "\"";
    ret += to_string (key_);
    ret += "\" = { ";
    ret += format->getName ();
    ret += ", ";
    ret += STObject::getFullText ();
    ret += "}";
    return ret;
}